

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:583:55)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:583:55)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  anon_union_32_5_7b1e0779_for_value_3 *this_00;
  gc_heap *h;
  uint32_t uVar1;
  uint uVar2;
  value *pvVar3;
  undefined8 *puVar4;
  long *plVar5;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar6;
  uint uVar7;
  mjs *this_01;
  wstring i2;
  wstring i1;
  value v1;
  value v2;
  wstring_view local_100;
  wstring local_f0;
  wstring local_d0;
  undefined1 local_b0 [16];
  value *local_a0;
  value *local_98;
  value local_90;
  value local_68;
  
  pvVar3 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar3);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (this_->type_ == object) {
    this_00 = &this_->field_1;
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_00->s_);
    local_68._0_8_ = 6;
    local_68.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)0x19c278;
    (**(code **)*puVar4)(&local_90,puVar4);
    uVar1 = to_uint32(&local_90);
    local_a0 = this_;
    local_98 = __return_storage_ptr__;
    value::destroy(&local_90);
    if (1 < uVar1) {
      h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
      uVar2 = uVar1 >> 1;
      this_01 = (mjs *)0x0;
      uVar6 = extraout_RDX;
      do {
        uVar1 = uVar1 - 1;
        index_string_abi_cxx11_(&local_d0,this_01,(uint32_t)uVar6);
        index_string_abi_cxx11_(&local_f0,(mjs *)(ulong)uVar1,index);
        puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_00->s_);
        local_68._0_8_ = local_d0._M_string_length;
        local_68.field_1.n_ = (double)local_d0._M_dataplus._M_p;
        (**(code **)*puVar4)(&local_90,puVar4,&local_68);
        puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_00->s_);
        local_b0._0_8_ = local_f0._M_string_length;
        local_b0._8_8_ = local_f0._M_dataplus._M_p;
        (**(code **)*puVar4)(&local_68,puVar4,(gc_heap_ptr_untyped *)local_b0);
        plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_00->s_);
        local_100._M_len = local_d0._M_string_length;
        local_100._M_str = local_d0._M_dataplus._M_p;
        string::string((string *)local_b0,h,&local_100);
        (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)local_b0,&local_68,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b0);
        plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_00->s_);
        local_100._M_len = local_f0._M_string_length;
        local_100._M_str = local_f0._M_dataplus._M_p;
        string::string((string *)local_b0,h,&local_100);
        (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)local_b0,&local_90,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b0);
        value::destroy(&local_68);
        value::destroy(&local_90);
        uVar6 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity * 4 + 4);
          uVar6 = extraout_RDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity * 4 + 4);
          uVar6 = extraout_RDX_02;
        }
        uVar7 = (int)this_01 + 1;
        this_01 = (mjs *)(ulong)uVar7;
      } while (uVar2 != uVar7);
    }
    pvVar3 = local_98;
    value::value(local_98,local_a0);
    return pvVar3;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }